

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::AssertionItemPortSyntax::AssertionItemPortSyntax
          (AssertionItemPortSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token local,Token direction
          ,DataTypeSyntax *type,Token name,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,
          EqualsAssertionArgClauseSyntax *defaultValue)

{
  pointer ppAVar1;
  size_type sVar2;
  pointer ppVVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  DataTypeSyntax *pDVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 uVar9;
  DataTypeSyntax *local_30;
  
  uVar9 = direction._0_8_;
  uVar7 = local._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = AssertionItemPort;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->attributes).super_SyntaxListBase.childCount = (attributes->super_SyntaxListBase).childCount
  ;
  sVar2 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  data_ = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  size_ = sVar2;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004703a8;
  (this->local).kind = (short)uVar7;
  (this->local).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->local).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->local).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->local).info = local.info;
  (this->direction).kind = (short)uVar9;
  (this->direction).field_0x2 = (char)((ulong)uVar9 >> 0x10);
  (this->direction).numFlags = (NumericTokenFlags)(char)((ulong)uVar9 >> 0x18);
  (this->direction).rawLen = (int)((ulong)uVar9 >> 0x20);
  (this->direction).info = direction.info;
  local_30 = type;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,&local_30);
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  SVar4 = (dimensions->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(dimensions->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent =
       (dimensions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->dimensions).super_SyntaxListBase.childCount = (dimensions->super_SyntaxListBase).childCount
  ;
  sVar2 = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  data_ = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  size_ = sVar2;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004702d8;
  this->defaultValue = defaultValue;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  ppAVar1 = (this->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    **(undefined8 **)((long)ppAVar1 + lVar8) = this;
  }
  pDVar6 = not_null<slang::syntax::DataTypeSyntax_*>::get(&this->type);
  (pDVar6->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  ppVVar3 = (this->dimensions).
            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.size_;
  for (lVar8 = 0; sVar2 << 3 != lVar8; lVar8 = lVar8 + 8) {
    **(undefined8 **)((long)ppVVar3 + lVar8) = this;
  }
  if (this->defaultValue != (EqualsAssertionArgClauseSyntax *)0x0) {
    (this->defaultValue->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

AssertionItemPortSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token local, Token direction, DataTypeSyntax& type, Token name, const SyntaxList<VariableDimensionSyntax>& dimensions, EqualsAssertionArgClauseSyntax* defaultValue) :
        SyntaxNode(SyntaxKind::AssertionItemPort), attributes(attributes), local(local), direction(direction), type(&type), name(name), dimensions(dimensions), defaultValue(defaultValue) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
        if (this->defaultValue) this->defaultValue->parent = this;
    }